

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

void rapidjson::internal::
     Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
     ::AssignIfExist(SizeType *out,ValueType *value,ValueType *name)

{
  ulong uVar1;
  ConstMemberIterator CVar2;
  Pointer local_20;
  
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&local_20,value);
  CVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberEnd(value);
  if (((local_20 != CVar2.ptr_) &&
      ((undefined1  [16])
       ((undefined1  [16])(local_20->value).data_ & (undefined1  [16])0x100000000000000) !=
       (undefined1  [16])0x0)) && (uVar1 = *(ulong *)&(local_20->value).data_, uVar1 >> 0x20 == 0))
  {
    *out = (SizeType)uVar1;
  }
  return;
}

Assistant:

static void AssignIfExist(SizeType& out, const ValueType& value, const ValueType& name) {
        if (const ValueType* v = GetMember(value, name))
            if (v->IsUint64() && v->GetUint64() <= SizeType(~0))
                out = static_cast<SizeType>(v->GetUint64());
    }